

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_sse4.c
# Opt level: O0

void prepare_warp_vertical_filter
               (uint8_t *pred,__m128i *tmp,ConvolveParams *conv_params,int16_t gamma,int16_t delta,
               int p_height,int p_stride,int p_width,int i,int j,int sy4,int reduce_bits_vert,
               __m128i *res_add_const,int round_bits,int offset_bits)

{
  short in_CX;
  short in_R8W;
  int in_stack_00000088;
  int16_t in_stack_0000008c;
  int16_t in_stack_0000008e;
  ConvolveParams *in_stack_00000090;
  int in_stack_00000098;
  int16_t in_stack_0000009c;
  int16_t in_stack_0000009e;
  undefined4 in_stack_000000a4;
  undefined4 in_stack_000000ac;
  undefined4 in_stack_000000b4;
  int in_stack_000000e8;
  int in_stack_000000f0;
  int in_stack_000000f8;
  int in_stack_00000100;
  int in_stack_00000108;
  int in_stack_00000110;
  undefined4 in_stack_00000114;
  int in_stack_00000118;
  int in_stack_00000120;
  undefined4 in_stack_00000124;
  int in_stack_00000128;
  int in_stack_00000130;
  
  if ((in_CX == 0) && (in_R8W == 0)) {
    warp_vertical_filter_gamma0_delta0
              ((uint8_t *)CONCAT44(in_stack_000000a4,p_stride),
               (__m128i *)CONCAT26(in_stack_0000009e,CONCAT24(in_stack_0000009c,in_stack_00000098)),
               in_stack_00000090,in_stack_0000008e,in_stack_0000008c,in_stack_00000088,offset_bits,
               in_stack_000000e8,in_stack_000000f0,in_stack_000000f8,in_stack_00000100,
               in_stack_00000108,(__m128i *)CONCAT44(in_stack_00000114,in_stack_00000110),
               in_stack_00000118,in_stack_00000120);
  }
  else if ((in_CX == 0) && (in_R8W != 0)) {
    warp_vertical_filter_gamma0
              ((uint8_t *)CONCAT44(in_stack_000000b4,i),
               (__m128i *)CONCAT44(in_stack_000000ac,p_width),
               (ConvolveParams *)CONCAT44(in_stack_000000a4,p_stride),in_stack_0000009e,
               in_stack_0000009c,in_stack_00000098,in_stack_000000f0,in_stack_000000f8,
               in_stack_00000100,in_stack_00000108,in_stack_00000110,in_stack_00000118,
               (__m128i *)CONCAT44(in_stack_00000124,in_stack_00000120),in_stack_00000128,
               in_stack_00000130);
  }
  else if ((in_CX == 0) || (in_R8W != 0)) {
    warp_vertical_filter
              ((uint8_t *)CONCAT44(in_stack_000000b4,i),
               (__m128i *)CONCAT44(in_stack_000000ac,p_width),
               (ConvolveParams *)CONCAT44(in_stack_000000a4,p_stride),in_stack_0000009e,
               in_stack_0000009c,in_stack_00000098,in_stack_000000f0,in_stack_000000f8,
               in_stack_00000100,in_stack_00000108,in_stack_00000110,in_stack_00000118,
               (__m128i *)CONCAT44(in_stack_00000124,in_stack_00000120),in_stack_00000128,
               in_stack_00000130);
  }
  else {
    warp_vertical_filter_delta0
              ((uint8_t *)CONCAT44(in_stack_000000a4,p_stride),
               (__m128i *)CONCAT26(in_stack_0000009e,CONCAT24(in_stack_0000009c,in_stack_00000098)),
               in_stack_00000090,in_stack_0000008e,in_stack_0000008c,in_stack_00000088,offset_bits,
               in_stack_000000e8,in_stack_000000f0,in_stack_000000f8,in_stack_00000100,
               in_stack_00000108,(__m128i *)CONCAT44(in_stack_00000114,in_stack_00000110),
               in_stack_00000118,in_stack_00000120);
  }
  return;
}

Assistant:

static inline void prepare_warp_vertical_filter(
    uint8_t *pred, __m128i *tmp, ConvolveParams *conv_params, int16_t gamma,
    int16_t delta, int p_height, int p_stride, int p_width, int i, int j,
    int sy4, const int reduce_bits_vert, const __m128i *res_add_const,
    const int round_bits, const int offset_bits) {
  if (gamma == 0 && delta == 0)
    warp_vertical_filter_gamma0_delta0(
        pred, tmp, conv_params, gamma, delta, p_height, p_stride, p_width, i, j,
        sy4, reduce_bits_vert, res_add_const, round_bits, offset_bits);
  else if (gamma == 0 && delta != 0)
    warp_vertical_filter_gamma0(pred, tmp, conv_params, gamma, delta, p_height,
                                p_stride, p_width, i, j, sy4, reduce_bits_vert,
                                res_add_const, round_bits, offset_bits);
  else if (gamma != 0 && delta == 0)
    warp_vertical_filter_delta0(pred, tmp, conv_params, gamma, delta, p_height,
                                p_stride, p_width, i, j, sy4, reduce_bits_vert,
                                res_add_const, round_bits, offset_bits);
  else
    warp_vertical_filter(pred, tmp, conv_params, gamma, delta, p_height,
                         p_stride, p_width, i, j, sy4, reduce_bits_vert,
                         res_add_const, round_bits, offset_bits);
}